

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  cpp_dec_float<100U,_int,_void> *pcVar9;
  long lVar10;
  int iVar11;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar12;
  cpp_dec_float<100U,_int,_void> *pcVar13;
  int *piVar14;
  uint *puVar15;
  bool bVar16;
  undefined8 uVar17;
  type t;
  int local_1c4;
  cpp_dec_float<100U,_int,_void> local_1b8;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  uint local_138 [3];
  undefined3 uStack_12b;
  uint uStack_128;
  bool bStack_124;
  undefined8 local_120;
  int *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  int *local_108;
  pointer local_100;
  long local_f8;
  int *local_f0;
  int *local_e8;
  long local_e0;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  iVar1 = (this->l).firstUpdate;
  iVar8 = (this->l).firstUnused;
  lVar12 = (long)iVar8;
  local_1c4 = n;
  if (iVar1 < iVar8) {
    local_100 = (this->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_108 = (this->l).idx;
    local_e8 = (this->l).row;
    local_f0 = (this->l).start;
    local_118 = nonz;
    local_110 = eps;
    do {
      iVar8 = local_e8[lVar12 + -1];
      lVar10 = (long)iVar8;
      local_e0 = lVar10 * 0x50;
      uVar17 = *(undefined8 *)vec[lVar10].m_backend.data._M_elems;
      uVar2 = *(undefined8 *)(vec[lVar10].m_backend.data._M_elems + 2);
      puVar15 = vec[lVar10].m_backend.data._M_elems + 4;
      uVar3 = *(undefined8 *)puVar15;
      uVar4 = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar10].m_backend.data._M_elems + 8;
      uVar5 = *(undefined8 *)puVar15;
      uVar6 = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar10].m_backend.data._M_elems + 0xc;
      uVar7 = *(undefined8 *)puVar15;
      local_1b8.data._M_elems._56_8_ = *(undefined8 *)(puVar15 + 2);
      local_1b8.data._M_elems[0xc] = (uint)uVar7;
      local_1b8.data._M_elems[0xd] = (uint)((ulong)uVar7 >> 0x20);
      local_1b8.data._M_elems[8] = (uint)uVar5;
      local_1b8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
      local_1b8.data._M_elems[10] = (uint)uVar6;
      local_1b8.data._M_elems[0xb] = (uint)((ulong)uVar6 >> 0x20);
      local_1b8.data._M_elems[4] = (uint)uVar3;
      local_1b8.data._M_elems[5] = (uint)((ulong)uVar3 >> 0x20);
      local_1b8.data._M_elems[6] = (uint)uVar4;
      local_1b8.data._M_elems[7] = (uint)((ulong)uVar4 >> 0x20);
      local_1b8.data._M_elems[0] = (uint)uVar17;
      local_1b8.data._M_elems[1] = (uint)((ulong)uVar17 >> 0x20);
      local_1b8.data._M_elems[2] = (uint)uVar2;
      local_1b8.data._M_elems[3] = (uint)((ulong)uVar2 >> 0x20);
      local_1b8.exp = vec[lVar10].m_backend.exp;
      local_1b8.neg = vec[lVar10].m_backend.neg;
      local_1b8.fpclass = vec[lVar10].m_backend.fpclass;
      local_1b8.prec_elem = vec[lVar10].m_backend.prec_elem;
      puVar15 = vec[lVar10].m_backend.data._M_elems + 1;
      local_d8.data._M_elems._4_8_ = *(undefined8 *)puVar15;
      local_d8.data._M_elems._12_8_ = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar10].m_backend.data._M_elems + 5;
      local_d8.data._M_elems._20_8_ = *(undefined8 *)puVar15;
      local_d8.data._M_elems._28_8_ = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar10].m_backend.data._M_elems + 9;
      local_d8.data._M_elems._36_8_ = *(undefined8 *)puVar15;
      uVar17 = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar10].m_backend.data._M_elems + 0xc;
      local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar15 + 2);
      local_d8.data._M_elems[0xd] = (uint)((ulong)*(undefined8 *)puVar15 >> 0x20);
      local_d8.data._M_elems[0xb] = (uint)uVar17;
      local_d8.data._M_elems[0xc] = (uint)((ulong)uVar17 >> 0x20);
      local_d8.data._M_elems[0] = local_1b8.data._M_elems[0];
      local_d8.neg = (bool)((local_1b8.data._M_elems[0] != 0 ||
                            local_1b8.fpclass != cpp_dec_float_finite) ^ local_1b8.neg);
      iVar11 = local_f0[lVar12];
      local_d8.exp = local_1b8.exp;
      local_d8.fpclass = local_1b8.fpclass;
      local_d8.prec_elem = local_1b8.prec_elem;
      if (iVar8 < iVar11) {
        piVar14 = local_108 + local_f0[lVar12 + -1];
        pcVar13 = &local_100[local_f0[lVar12 + -1]].m_backend;
        local_f8 = lVar12;
        do {
          pcVar9 = &vec[*piVar14].m_backend;
          local_120._0_4_ = cpp_dec_float_finite;
          local_120._4_4_ = 0x10;
          local_168 = (undefined1  [16])0x0;
          local_158 = (undefined1  [16])0x0;
          local_148 = (undefined1  [16])0x0;
          local_138[0] = 0;
          local_138[1] = 0;
          stack0xfffffffffffffed0 = 0;
          uStack_12b = 0;
          uStack_128 = 0;
          bStack_124 = false;
          v = pcVar9;
          if ((pcVar13 != (cpp_dec_float<100U,_int,_void> *)local_168) &&
             (v = pcVar13, (cpp_dec_float<100U,_int,_void> *)local_168 != pcVar9)) {
            local_168 = *(undefined1 (*) [16])(pcVar9->data)._M_elems;
            local_158 = *(undefined1 (*) [16])((pcVar9->data)._M_elems + 4);
            local_148 = *(undefined1 (*) [16])((pcVar9->data)._M_elems + 8);
            local_138._0_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 0xc);
            uVar17 = *(undefined8 *)((pcVar9->data)._M_elems + 0xe);
            stack0xfffffffffffffed0 = (undefined5)uVar17;
            uStack_12b = (undefined3)((ulong)uVar17 >> 0x28);
            uStack_128 = pcVar9->exp;
            bStack_124 = pcVar9->neg;
            local_120._0_4_ = pcVar9->fpclass;
            local_120._4_4_ = pcVar9->prec_elem;
          }
          piVar14 = piVar14 + 1;
          pcVar13 = pcVar13 + 1;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_168,v);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_d8,(cpp_dec_float<100U,_int,_void> *)local_168);
          iVar11 = iVar11 + -1;
          lVar12 = local_f8;
        } while (iVar8 < iVar11);
      }
      puVar15 = (uint *)((long)(vec->m_backend).data._M_elems + local_e0);
      if (local_1b8.fpclass == cpp_dec_float_NaN) {
LAB_003f5edf:
        local_1b8.data._M_elems[0xd] = local_d8.data._M_elems[0xd];
        local_1b8.data._M_elems[0xe] = local_d8.data._M_elems[0xe];
        local_1b8.data._M_elems[0xf] = local_d8.data._M_elems[0xf];
        local_1b8.data._M_elems[9] = local_d8.data._M_elems[9];
        local_1b8.data._M_elems[10] = local_d8.data._M_elems[10];
        local_1b8.data._M_elems[0xb] = local_d8.data._M_elems[0xb];
        local_1b8.data._M_elems[0xc] = local_d8.data._M_elems[0xc];
        local_1b8.data._M_elems[5] = local_d8.data._M_elems[5];
        local_1b8.data._M_elems[6] = local_d8.data._M_elems[6];
        local_1b8.data._M_elems[7] = local_d8.data._M_elems[7];
        local_1b8.data._M_elems[8] = local_d8.data._M_elems[8];
        local_1b8.data._M_elems[1] = local_d8.data._M_elems[1];
        local_1b8.data._M_elems[2] = local_d8.data._M_elems[2];
        local_1b8.data._M_elems[3] = local_d8.data._M_elems[3];
        local_1b8.data._M_elems[4] = local_d8.data._M_elems[4];
        local_1b8.neg =
             (bool)((local_d8.fpclass != cpp_dec_float_finite || local_d8.data._M_elems[0] != 0) ^
                   local_d8.neg);
        local_1b8.data._M_elems[0] = local_d8.data._M_elems[0];
        local_1b8.exp = local_d8.exp;
        local_1b8.fpclass = local_d8.fpclass;
        local_1b8.prec_elem = local_d8.prec_elem;
        if (local_d8.fpclass == cpp_dec_float_NaN) {
          uVar17._4_4_ = local_d8.prec_elem;
          uVar17._0_4_ = cpp_dec_float_NaN;
LAB_003f5f71:
          local_168._4_4_ = local_1b8.data._M_elems[1];
          local_168._0_4_ = local_1b8.data._M_elems[0];
          local_168._12_4_ = local_1b8.data._M_elems[3];
          local_168._8_4_ = local_1b8.data._M_elems[2];
          local_158._4_4_ = local_1b8.data._M_elems[5];
          local_158._0_4_ = local_1b8.data._M_elems[4];
          local_158._12_4_ = local_1b8.data._M_elems[7];
          local_158._8_4_ = local_1b8.data._M_elems[6];
          local_148._4_4_ = local_1b8.data._M_elems[9];
          local_148._0_4_ = local_1b8.data._M_elems[8];
          local_148._12_4_ = local_1b8.data._M_elems[0xb];
          local_148._8_4_ = local_1b8.data._M_elems[10];
          local_138[1] = local_1b8.data._M_elems[0xd];
          local_138[0] = local_1b8.data._M_elems[0xc];
          stack0xfffffffffffffed0 = local_1b8.data._M_elems._56_5_;
          uStack_12b = local_1b8.data._M_elems[0xf]._1_3_;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<100U,_int,_void> *)local_168,0,(type *)0x0);
          iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_1b8,(cpp_dec_float<100U,_int,_void> *)local_168);
          if (iVar8 != 0) {
            uVar17._4_4_ = local_1b8.prec_elem;
            uVar17._0_4_ = local_1b8.fpclass;
            local_d8.exp = local_1b8.exp;
            goto LAB_003f5f71;
          }
          local_120._0_4_ = cpp_dec_float_finite;
          local_120._4_4_ = 0x10;
          local_168 = ZEXT816(0);
          local_158 = ZEXT816(0);
          local_148 = ZEXT816(0);
          local_138[0] = 0;
          local_138[1] = 0;
          stack0xfffffffffffffed0 = 0;
          uStack_12b = 0;
          uStack_128 = 0;
          bStack_124 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_168,1e-100);
          local_d8.exp = uStack_128;
          local_1b8.neg = bStack_124;
          uVar17 = local_120;
        }
        *(undefined8 *)(puVar15 + 0xc) = local_138._0_8_;
        *(ulong *)(puVar15 + 0xe) = CONCAT35(uStack_12b,stack0xfffffffffffffed0);
        *(undefined8 *)(puVar15 + 8) = local_148._0_8_;
        *(undefined8 *)(puVar15 + 10) = local_148._8_8_;
        *(undefined8 *)(puVar15 + 4) = local_158._0_8_;
        *(undefined8 *)(puVar15 + 6) = local_158._8_8_;
        *(undefined8 *)puVar15 = local_168._0_8_;
        *(undefined8 *)(puVar15 + 2) = local_168._8_8_;
        puVar15[0x10] = local_d8.exp;
        *(bool *)(puVar15 + 0x11) = local_1b8.neg;
        puVar15[0x12] = (fpclass_type)uVar17;
        puVar15[0x13] = SUB84(uVar17,4);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<100U,_int,_void> *)local_168,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_1b8,(cpp_dec_float<100U,_int,_void> *)local_168);
        if (iVar11 != 0) goto LAB_003f5edf;
        local_1b8.data._M_elems[0xd] = local_d8.data._M_elems[0xd];
        local_1b8.data._M_elems[0xe] = local_d8.data._M_elems[0xe];
        local_1b8.data._M_elems[0xf] = local_d8.data._M_elems[0xf];
        local_1b8.data._M_elems[9] = local_d8.data._M_elems[9];
        local_1b8.data._M_elems[10] = local_d8.data._M_elems[10];
        local_1b8.data._M_elems[0xb] = local_d8.data._M_elems[0xb];
        local_1b8.data._M_elems[0xc] = local_d8.data._M_elems[0xc];
        local_1b8.data._M_elems[5] = local_d8.data._M_elems[5];
        local_1b8.data._M_elems[6] = local_d8.data._M_elems[6];
        local_1b8.data._M_elems[7] = local_d8.data._M_elems[7];
        local_1b8.data._M_elems[8] = local_d8.data._M_elems[8];
        local_1b8.data._M_elems[1] = local_d8.data._M_elems[1];
        local_1b8.data._M_elems[2] = local_d8.data._M_elems[2];
        local_1b8.data._M_elems[3] = local_d8.data._M_elems[3];
        local_1b8.data._M_elems[4] = local_d8.data._M_elems[4];
        bVar16 = local_d8.fpclass != cpp_dec_float_finite || local_d8.data._M_elems[0] != 0;
        local_1b8.neg = (bool)(local_d8.neg ^ bVar16);
        local_1b8.data._M_elems[0] = local_d8.data._M_elems[0];
        local_1b8.exp = local_d8.exp;
        local_1b8.fpclass = local_d8.fpclass;
        local_1b8.prec_elem = local_d8.prec_elem;
        local_158._4_4_ = local_1b8.data._M_elems[5];
        local_158._0_4_ = local_1b8.data._M_elems[4];
        local_158._12_4_ = local_1b8.data._M_elems[7];
        local_158._8_4_ = local_1b8.data._M_elems[6];
        local_148._4_4_ = local_1b8.data._M_elems[9];
        local_148._0_4_ = local_1b8.data._M_elems[8];
        local_148._12_4_ = local_d8.data._M_elems[0xb];
        local_148._8_4_ = local_1b8.data._M_elems[10];
        local_138[1] = local_d8.data._M_elems[0xd];
        local_138[0] = local_d8.data._M_elems[0xc];
        stack0xfffffffffffffed0 = local_d8.data._M_elems._56_5_;
        uStack_12b = local_d8.data._M_elems[0xf]._1_3_;
        local_168._4_4_ = local_d8.data._M_elems[1];
        local_168._8_4_ = local_d8.data._M_elems[2];
        local_168._0_4_ = local_d8.data._M_elems[0];
        local_168._12_4_ = local_1b8.data._M_elems[3];
        local_88.data._M_elems._0_8_ = *(undefined8 *)(local_110->m_backend).data._M_elems;
        local_88.data._M_elems._8_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 2);
        local_88.data._M_elems._16_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 4);
        local_88.data._M_elems._24_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 6);
        local_88.data._M_elems._32_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 8);
        local_88.data._M_elems._40_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 10);
        local_88.data._M_elems._48_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 0xc);
        local_88.data._M_elems._56_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 0xe);
        local_88.exp = (local_110->m_backend).exp;
        local_88.neg = (local_110->m_backend).neg;
        local_88.fpclass = (local_110->m_backend).fpclass;
        local_88.prec_elem = (local_110->m_backend).prec_elem;
        uStack_128 = local_d8.exp;
        local_120._4_4_ = local_d8.prec_elem;
        local_120._0_4_ = local_d8.fpclass;
        bStack_124 = local_1b8.neg;
        if ((local_d8.neg != bVar16) &&
           (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite)) {
          bStack_124 = (bool)(local_1b8.neg ^ 1);
        }
        if ((local_88.fpclass != cpp_dec_float_NaN && local_d8.fpclass != cpp_dec_float_NaN) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_168,&local_88), 0 < iVar11))
        {
          lVar10 = (long)local_1c4;
          local_1c4 = local_1c4 + 1;
          local_118[lVar10] = iVar8;
          *(ulong *)(puVar15 + 0xc) =
               CONCAT44(local_1b8.data._M_elems[0xd],local_1b8.data._M_elems[0xc]);
          *(undefined8 *)(puVar15 + 0xe) = local_1b8.data._M_elems._56_8_;
          *(ulong *)(puVar15 + 8) = CONCAT44(local_1b8.data._M_elems[9],local_1b8.data._M_elems[8]);
          *(ulong *)(puVar15 + 10) =
               CONCAT44(local_1b8.data._M_elems[0xb],local_1b8.data._M_elems[10]);
          *(ulong *)(puVar15 + 4) = CONCAT44(local_1b8.data._M_elems[5],local_1b8.data._M_elems[4]);
          *(ulong *)(puVar15 + 6) = CONCAT44(local_1b8.data._M_elems[7],local_1b8.data._M_elems[6]);
          *(ulong *)puVar15 = CONCAT44(local_1b8.data._M_elems[1],local_1b8.data._M_elems[0]);
          *(ulong *)(puVar15 + 2) = CONCAT44(local_1b8.data._M_elems[3],local_1b8.data._M_elems[2]);
          puVar15[0x10] = local_1b8.exp;
          *(bool *)(puVar15 + 0x11) = local_1b8.neg;
          *(ulong *)(puVar15 + 0x12) = CONCAT44(local_1b8.prec_elem,local_1b8.fpclass);
        }
      }
      lVar12 = lVar12 + -1;
    } while (iVar1 < lVar12);
  }
  return local_1c4;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}